

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_FindMatchingFont(uchar *fontdata,char *name,int flags)

{
  uint fontstart;
  int iVar1;
  stbtt_uint32 sVar2;
  size_t sVar3;
  stbtt_int32 next_id;
  stbtt_int32 nlen;
  stbtt_int32 nlen_00;
  int index;
  undefined8 local_38;
  
  fontstart = stbtt_GetFontOffsetForIndex(fontdata,0);
  if (-1 < (int)fontstart) {
    sVar3 = strlen(name);
    local_38 = CONCAT44(flags,flags) & 0xffffffff00000007;
    index = 1;
    do {
      iVar1 = stbtt__isfont(fontdata + fontstart);
      if (iVar1 != 0) {
        nlen_00 = (stbtt_int32)sVar3;
        if (local_38._4_4_ == 0) {
          sVar2 = stbtt__find_table(fontdata,fontstart,"name");
          if (sVar2 != 0) {
            iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen_00,0x10,0x11);
            if (iVar1 != 0) {
              return fontstart;
            }
            next_id = 2;
            goto LAB_001373bf;
          }
        }
        else {
          sVar2 = stbtt__find_table(fontdata,fontstart,"head");
          if (((uint)local_38 == (fontdata[(ulong)sVar2 + 0x2d] & 7)) &&
             (sVar2 = stbtt__find_table(fontdata,fontstart,"name"), sVar2 != 0)) {
            iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen_00,0x10,-1);
            if (iVar1 != 0) {
              return fontstart;
            }
            next_id = -1;
LAB_001373bf:
            iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen_00,1,next_id);
            if (iVar1 != 0) {
              return fontstart;
            }
            iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen_00,3,-1);
            if (iVar1 != 0) {
              return fontstart;
            }
          }
        }
      }
      fontstart = stbtt_GetFontOffsetForIndex(fontdata,index);
      index = index + 1;
    } while (-1 < (int)fontstart);
  }
  return fontstart;
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *fontdata, const char *name, int flags)
{
   return stbtt_FindMatchingFont_internal((unsigned char *) fontdata, (char *) name, flags);
}